

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.c
# Opt level: O3

exr_result_t
internal_coding_fill_channel_info
          (exr_coding_channel_info_t **channels,int16_t *num_chans,
          exr_coding_channel_info_t *builtinextras,exr_chunk_info_t *cinfo,exr_const_context_t ctxt,
          exr_const_priv_part_t part)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  exr_pixel_type_t eVar6;
  exr_attr_chlist_t *peVar7;
  size_t __n;
  uint uVar8;
  exr_result_t eVar9;
  int iVar10;
  uint uVar11;
  int32_t *piVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  
  peVar7 = (part->channels->field_6).chlist;
  uVar1 = peVar7->num_channels;
  if ((long)(int)uVar1 < 6) {
    if ((int)uVar1 < 1) goto LAB_0012cb2b;
  }
  else {
    __n = (long)(int)uVar1 * 0x30;
    builtinextras = (exr_coding_channel_info_t *)(*ctxt->alloc_fn)(__n);
    if (builtinextras == (exr_coding_channel_info_t *)0x0) {
      eVar9 = (*ctxt->standard_error)(ctxt,1);
      return eVar9;
    }
    memset(builtinextras,0,__n);
  }
  iVar2 = cinfo->start_y;
  uVar3 = cinfo->height;
  uVar13 = (iVar2 + uVar3) - 1;
  uVar8 = 1 - (iVar2 + uVar3);
  if (0 < (int)(iVar2 + uVar3)) {
    uVar8 = uVar13;
  }
  iVar4 = cinfo->width;
  piVar12 = &peVar7->entries->y_sampling;
  lVar14 = 0;
  do {
    *(char **)((long)&builtinextras->channel_name + lVar14) = *(char **)(piVar12 + -5);
    uVar5 = *piVar12;
    uVar11 = uVar3;
    if (1 < (int)uVar5) {
      iVar10 = iVar2 % (int)uVar5;
      if (uVar3 == 1) {
        uVar11 = (uint)(iVar10 == 0);
      }
      else {
        iVar15 = uVar5 - iVar10;
        if (iVar10 == 0) {
          iVar15 = 0;
        }
        uVar11 = 0;
        iVar10 = uVar13 - uVar8 % uVar5;
        if (iVar15 + iVar2 <= iVar10) {
          uVar11 = (iVar10 - (iVar15 + iVar2)) / (int)uVar5 + 1;
        }
      }
    }
    *(uint *)((long)&builtinextras->height + lVar14) = uVar11;
    uVar11 = piVar12[-1];
    iVar10 = 1;
    if ((int)uVar11 < 2) {
      iVar10 = iVar4;
    }
    if (1 < (int)uVar11 && iVar4 != 1) {
      iVar10 = iVar4 / (int)uVar11;
    }
    *(int *)((long)&builtinextras->width + lVar14) = iVar10;
    *(uint *)((long)&builtinextras->x_samples + lVar14) = uVar11;
    *(uint *)((long)&builtinextras->y_samples + lVar14) = uVar5;
    (&builtinextras->p_linear)[lVar14] = *(uint8_t *)(piVar12 + -2);
    eVar6 = piVar12[-3];
    (&builtinextras->bytes_per_element)[lVar14] = (eVar6 != EXR_PIXEL_HALF) * '\x02' + '\x02';
    *(short *)((long)&builtinextras->data_type + lVar14) = (short)eVar6;
    *(ushort *)((long)&builtinextras->user_bytes_per_element + lVar14) =
         (ushort)(eVar6 != EXR_PIXEL_HALF) * 2 + 2;
    *(short *)((long)&builtinextras->user_data_type + lVar14) = (short)eVar6;
    lVar14 = lVar14 + 0x30;
    piVar12 = piVar12 + 8;
  } while ((ulong)uVar1 * 0x30 != lVar14);
LAB_0012cb2b:
  *channels = builtinextras;
  *num_chans = (int16_t)uVar1;
  return 0;
}

Assistant:

exr_result_t
internal_coding_fill_channel_info (
    exr_coding_channel_info_t** channels,
    int16_t*                    num_chans,
    exr_coding_channel_info_t*  builtinextras,
    const exr_chunk_info_t*     cinfo,
    exr_const_context_t         ctxt,
    exr_const_priv_part_t       part)
{
    int                        chans;
    exr_attr_chlist_t*         chanlist;
    exr_coding_channel_info_t* chanfill;

    chanlist = part->channels->chlist;
    chans    = chanlist->num_channels;
    if (chans <= 5) { chanfill = builtinextras; }
    else
    {
        chanfill = ctxt->alloc_fn (
            (size_t) (chans) * sizeof (exr_coding_channel_info_t));
        if (chanfill == NULL)
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
        memset (
            chanfill, 0, (size_t) (chans) * sizeof (exr_coding_channel_info_t));
    }

    for (int c = 0; c < chans; ++c)
    {
        const exr_attr_chlist_entry_t* curc = (chanlist->entries + c);
        exr_coding_channel_info_t*     decc = (chanfill + c);

        decc->channel_name = curc->name.str;

        decc->height = compute_sampled_height (
            cinfo->height, curc->y_sampling, cinfo->start_y);
        decc->width = compute_sampled_width (
            cinfo->width, curc->x_sampling, cinfo->start_x);

        decc->x_samples         = curc->x_sampling;
        decc->y_samples         = curc->y_sampling;
        decc->p_linear          = curc->p_linear;
        decc->bytes_per_element = (curc->pixel_type == EXR_PIXEL_HALF) ? 2 : 4;
        decc->data_type         = (uint16_t) (curc->pixel_type);

        /* initialize these so they don't trip us up during decoding
         * when the user also chooses to skip a channel */
        decc->user_bytes_per_element = decc->bytes_per_element;
        decc->user_data_type         = decc->data_type;
        /* but leave the rest as zero for the user to fill in */
    }

    *channels  = chanfill;
    *num_chans = (int16_t) chans;

    return EXR_ERR_SUCCESS;
}